

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O3

adt_error_t adt_ary_sort(adt_ary_t *self,adt_vlt_func_t *key,_Bool reverse)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  adt_error_t aVar6;
  void **ppvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  aVar6 = '\x01';
  if (key != (adt_vlt_func_t *)0x0 && self != (adt_ary_t *)0x0) {
    iVar2 = self->s32CurLen;
    if (1 < iVar2) {
      uVar8 = 1;
      lVar10 = 0;
      uVar9 = 0;
      do {
        pvVar3 = self->pFirst[uVar8 - 1];
        pvVar4 = self->pFirst[uVar8];
        uVar5 = (*key)(pvVar3,pvVar4);
        if ((int)uVar5 < 0) {
          return '\b';
        }
        if (reverse) {
          uVar5 = (uint)(uVar5 == 0);
        }
        if (uVar5 == 0) {
          self->pFirst[uVar8] = pvVar3;
          if (1 < uVar8) {
            lVar12 = 1;
            lVar11 = lVar10;
            do {
              pvVar3 = *(void **)((long)self->pFirst + lVar11 + -8);
              uVar5 = (*key)(pvVar3,pvVar4);
              if ((int)uVar5 < 0) {
                return '\b';
              }
              if (reverse) {
                uVar5 = (uint)(uVar5 == 0);
              }
              if (uVar5 != 0) {
                ppvVar7 = (void **)((long)self->pFirst + lVar11);
                goto LAB_00104d3e;
              }
              *(void **)((long)self->pFirst + lVar11) = pvVar3;
              lVar1 = lVar12 + uVar9;
              lVar12 = lVar12 + -1;
              lVar11 = lVar11 + -8;
            } while (1 < lVar1 + -1);
          }
          ppvVar7 = self->pFirst;
LAB_00104d3e:
          *ppvVar7 = pvVar4;
        }
        uVar8 = uVar8 + 1;
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 8;
      } while (uVar9 != iVar2 - 1);
    }
    aVar6 = '\0';
  }
  return aVar6;
}

Assistant:

adt_error_t adt_ary_sort(adt_ary_t *self, adt_vlt_func_t *key, bool reverse)
{
   if ( (self == 0) || (key == 0) )
   {
      return ADT_INVALID_ARGUMENT_ERROR;
   }
   ///TODO: For now we simply use insertion sort. Will need to implement Timsort later on.
   return adt_ary_insertion_sort(self, key, reverse);
}